

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlb_helper.c
# Opt level: O3

void arm_cpu_do_transaction_failed_aarch64
               (CPUState *cs,hwaddr physaddr,vaddr addr,uint size,MMUAccessType access_type,
               int mmu_idx,MemTxAttrs attrs,MemTxResult response,uintptr_t retaddr)

{
  ARMCPU_conflict1 *cpu;
  ARMMMUFaultInfo_conflict1 local_58;
  
  local_58.level = 0;
  local_58.domain = 0;
  local_58.stage2 = false;
  local_58.s1ptw = false;
  local_58.ea = false;
  local_58._27_5_ = 0;
  local_58.type = ARMFault_None;
  local_58._4_4_ = 0;
  local_58.s2addr = 0;
  cpu_restore_state_aarch64(cs,retaddr,true);
  local_58.ea = response != 2;
  local_58.type = ARMFault_SyncExternal;
  arm_deliver_fault((ARMCPU_conflict1 *)cs,addr,access_type,mmu_idx,&local_58);
}

Assistant:

void arm_cpu_do_transaction_failed(CPUState *cs, hwaddr physaddr,
                                   vaddr addr, unsigned size,
                                   MMUAccessType access_type,
                                   int mmu_idx, MemTxAttrs attrs,
                                   MemTxResult response, uintptr_t retaddr)
{
    ARMCPU *cpu = ARM_CPU(cs);
    ARMMMUFaultInfo fi = { 0 };

    /* now we have a real cpu fault */
    cpu_restore_state(cs, retaddr, true);

    fi.ea = arm_extabort_type(response);
    fi.type = ARMFault_SyncExternal;
    arm_deliver_fault(cpu, addr, access_type, mmu_idx, &fi);
}